

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

bool boost::this_thread::interruption_requested(void)

{
  thread_data_base *this;
  lock_guard<boost::mutex> lg;
  thread_data_base *thread_info;
  mutex *in_stack_ffffffffffffffd8;
  bool local_1;
  
  this = detail::get_current_thread_data();
  if (this == (thread_data_base *)0x0) {
    local_1 = false;
  }
  else {
    lock_guard<boost::mutex>::lock_guard((lock_guard<boost::mutex> *)this,in_stack_ffffffffffffffd8)
    ;
    local_1 = (bool)(this->interrupt_requested & 1);
    lock_guard<boost::mutex>::~lock_guard((lock_guard<boost::mutex> *)0x2a4579);
  }
  return local_1;
}

Assistant:

bool interruption_requested() BOOST_NOEXCEPT
        {
            boost::detail::thread_data_base* const thread_info=detail::get_current_thread_data();
            if(!thread_info)
            {
                return false;
            }
            else
            {
                lock_guard<mutex> lg(thread_info->data_mutex);
                return thread_info->interrupt_requested;
            }
        }